

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.h
# Opt level: O0

void __thiscall Minisat::Solver::claBumpActivity(Solver *this,Clause *c)

{
  double dVar1;
  Size SVar2;
  float *pfVar3;
  uint *puVar4;
  Clause *this_00;
  float fVar5;
  int local_1c;
  int i;
  Clause *c_local;
  Solver *this_local;
  
  dVar1 = this->cla_inc;
  pfVar3 = Clause::activity(c);
  fVar5 = (float)((double)*pfVar3 + dVar1);
  *pfVar3 = fVar5;
  if (1e+20 < fVar5) {
    local_1c = 0;
    while( true ) {
      SVar2 = vec<unsigned_int,_int>::size(&this->learnts);
      if (SVar2 <= local_1c) break;
      puVar4 = vec<unsigned_int,_int>::operator[](&this->learnts,local_1c);
      this_00 = ClauseAllocator::operator[](&this->ca,*puVar4);
      pfVar3 = Clause::activity(this_00);
      *pfVar3 = *pfVar3 * 1e-20;
      local_1c = local_1c + 1;
    }
    this->cla_inc = this->cla_inc * 1e-20;
  }
  return;
}

Assistant:

inline void Solver::claBumpActivity (Clause& c) {
        if ( (c.activity() += cla_inc) > 1e20 ) {
            // Rescale:
            for (int i = 0; i < learnts.size(); i++)
                ca[learnts[i]].activity() *= 1e-20;
            cla_inc *= 1e-20; } }